

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O0

void accumulate_suite::test_overfull(void)

{
  initializer_list<int> input;
  iterator begin;
  iterator end;
  undefined4 local_b4;
  iterator local_b0;
  basic_iterator<int> local_a0;
  int local_8c [2];
  undefined4 local_84;
  iterator local_80;
  basic_iterator<int> local_70;
  int local_60 [2];
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  memset(&span.member.next,0,0x10);
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.next);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,begin,end);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input._M_len = 4;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_70 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_80 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_60[0] = std::
                accumulate<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                          (local_70,local_80,0);
  local_84 = 0x6e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","11 + 22 + 33 + 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1d,"void accumulate_suite::test_overfull()",local_60,&local_84);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_b0 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_8c[0] = std::
                accumulate<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                          (local_a0,local_b0,0);
  local_b4 = 0x9a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","22 + 33 + 44 + 55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1f,"void accumulate_suite::test_overfull()",local_8c,&local_b4);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 11 + 22 + 33 + 44);
    span.push_back(55);
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 22 + 33 + 44 + 55);
}